

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# central_freelist.cc
# Opt level: O2

bool __thiscall
tcmalloc::CentralFreeList::ShrinkCache(CentralFreeList *this,int locked_size_class,bool force)

{
  int iVar1;
  bool bVar2;
  undefined1 local_28 [8];
  LockInverter li;
  
  if ((this->cache_size_ == 0) || ((!force && (this->used_slots_ == this->cache_size_)))) {
    return false;
  }
  local_28 = (undefined1  [8])(Static::central_cache_ + (long)locked_size_class * 0x4c0);
  li.held_ = &this->lock_;
  SpinLock::Unlock((SpinLock *)local_28);
  SpinLock::Lock(&this->lock_);
  iVar1 = this->cache_size_;
  if ((long)iVar1 != 0) {
    if (this->used_slots_ != iVar1) {
      this->cache_size_ = iVar1 + -1;
      bVar2 = true;
      goto LAB_00115626;
    }
    if (force) {
      this->cache_size_ = iVar1 + -1;
      this->used_slots_ = iVar1 + -1;
      bVar2 = true;
      ReleaseListToSpans(this,this->tc_slots_[(long)iVar1 + -1].head);
      goto LAB_00115626;
    }
  }
  bVar2 = false;
LAB_00115626:
  anon_unknown_7::LockInverter::~LockInverter((LockInverter *)local_28);
  return bVar2;
}

Assistant:

bool CentralFreeList::ShrinkCache(int locked_size_class, bool force)
    NO_THREAD_SAFETY_ANALYSIS {
  // Start with a quick check without taking a lock.
  if (cache_size_ == 0) return false;
  // We don't evict from a full cache unless we are 'forcing'.
  if (force == false && used_slots_ == cache_size_) return false;

  // Grab lock, but first release the other lock held by this thread.  We use
  // the lock inverter to ensure that we never hold two size class locks
  // concurrently.  That can create a deadlock because there is no well
  // defined nesting order.
  LockInverter li(&Static::central_cache()[locked_size_class].lock_, &lock_);
  ASSERT(used_slots_ <= cache_size_);
  ASSERT(0 <= cache_size_);
  if (cache_size_ == 0) return false;
  if (used_slots_ == cache_size_) {
    if (force == false) return false;
    // ReleaseListToSpans releases the lock, so we have to make all the
    // updates to the central list before calling it.
    cache_size_--;
    used_slots_--;
    ReleaseListToSpans(tc_slots_[used_slots_].head);
    return true;
  }
  cache_size_--;
  return true;
}